

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void new_localvar(LexState *ls,TString *name,int n)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  FuncState *fs;
  FuncState *pFVar4;
  Proto *pPVar5;
  global_State *g;
  LocVar *pLVar6;
  long lVar7;
  
  fs = ls->fs;
  if ((int)((uint)fs->nactvar + n) < 200) {
    pFVar4 = ls->fs;
    pPVar5 = pFVar4->f;
    iVar2 = pPVar5->sizelocvars;
    if (iVar2 <= pFVar4->nlocvars) {
      pLVar6 = (LocVar *)
               luaM_growaux_(ls->L,pPVar5->locvars,&pPVar5->sizelocvars,0x10,0x7fff,
                             "too many local variables");
      pPVar5->locvars = pLVar6;
    }
    iVar3 = pPVar5->sizelocvars;
    if (iVar2 < iVar3) {
      lVar7 = (long)iVar3 - (long)iVar2;
      pLVar6 = pPVar5->locvars + iVar2;
      do {
        pLVar6->varname = (TString *)0x0;
        pLVar6 = pLVar6 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    pPVar5->locvars[pFVar4->nlocvars].varname = name;
    if ((((name->tsv).marked & 3) != 0) && ((pPVar5->marked & 4) != 0)) {
      g = ls->L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,(GCObject *)name);
      }
      else {
        pPVar5->marked = g->currentwhite & 3 | pPVar5->marked & 0xf8;
      }
    }
    uVar1 = pFVar4->nlocvars;
    pFVar4->nlocvars = uVar1 + 1;
    fs->actvar[(long)n + (ulong)fs->nactvar] = uVar1;
    return;
  }
  errorlimit(fs,200,"local variables");
}

Assistant:

static void new_localvar(LexState*ls,TString*name,int n){
FuncState*fs=ls->fs;
luaY_checklimit(fs,fs->nactvar+n+1,200,"local variables");
fs->actvar[fs->nactvar+n]=cast(unsigned short,registerlocalvar(ls,name));
}